

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tuple.cc
# Opt level: O2

t_object * __thiscall xemmai::t_tuple::f_string(t_tuple *this)

{
  wchar_t *pwVar1;
  t_object *ptVar2;
  t_stringer *ptVar3;
  ulong uVar4;
  long in_FS_OFFSET;
  wstring_view a_s;
  t_value<xemmai::t_pointer> x;
  t_stringer s;
  
  s.v_p = *(t_object **)(*(long *)(in_FS_OFFSET + -0x78) + 0x2e8);
  s.v_i = (wchar_t *)((s.v_p)->v_data + 8);
  s.v_j = s.v_i;
  ptVar3 = t_stringer::operator<<(&s,L'\'');
  t_stringer::operator<<(ptVar3,L'(');
  if (this->v_size != 0) {
    uVar4 = 1;
    while( true ) {
      t_value<xemmai::t_slot>::f_string((t_value<xemmai::t_slot> *)&x);
      f_check<xemmai::t_string>(x.super_t_pointer.v_p,L"value");
      a_s._M_str = (x.super_t_pointer.v_p)->v_data + 8;
      a_s._M_len = *(size_t *)(x.super_t_pointer.v_p)->v_data;
      t_stringer::operator<<(&s,a_s);
      if (this->v_size <= uVar4) break;
      ptVar3 = t_stringer::operator<<(&s,L',');
      t_stringer::operator<<(ptVar3,L' ');
      uVar4 = uVar4 + 1;
    }
  }
  ptVar3 = t_stringer::operator<<(&s,L')');
  pwVar1 = ptVar3->v_i;
  *pwVar1 = L'\0';
  ptVar2 = ptVar3->v_p;
  *(long *)ptVar2->v_data = (long)pwVar1 + (-0x50 - (long)ptVar2) >> 2;
  return ptVar2;
}

Assistant:

t_object* t_tuple::f_string() const
{
	t_stringer s;
	s << L'\'' << L'(';
	if (v_size > 0) for (size_t i = 0;;) {
		auto x = (*this)[i].f_string();
		f_check<t_string>(x, L"value");
		s << x->f_as<t_string>();
		if (++i >= v_size) break;
		s << L',' << L' ';
	}
	return s << L')';
}